

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitAtomicRMW(BinaryInstWriter *this,AtomicRMW *curr)

{
  uint8_t uVar1;
  int8_t x;
  BasicType BVar2;
  ulong uVar3;
  byte bVar4;
  char *pcVar5;
  
  BufferWithRandomAccess::operator<<(this->o,-2);
  switch(curr->op) {
  case RMWAdd:
    break;
  case RMWSub:
    BVar2 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar2 == i64) {
      bVar4 = curr->bytes - 1;
      if ((bVar4 < 8) && ((0x8bU >> (bVar4 & 0x1f) & 1) != 0)) {
        bVar4 = bVar4 * '\b';
        uVar3 = 0x262929292b292a29;
        goto LAB_00cea966;
      }
    }
    else {
      if (BVar2 != i32) {
        pcVar5 = "unexpected type";
        goto LAB_00ceaa83;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        x = '\'';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x04') {
        x = '%';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x02') {
        x = '(';
        goto LAB_00cea969;
      }
    }
    pcVar5 = "invalid rmw size";
LAB_00ceaa83:
    handle_unreachable(pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1e9);
  case RMWAnd:
    BVar2 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar2 == i64) {
      bVar4 = curr->bytes - 1;
      if ((bVar4 < 8) && ((0x8bU >> (bVar4 & 0x1f) & 1) != 0)) {
        bVar4 = bVar4 * '\b';
        uVar3 = 0x2d30303032303130;
        goto LAB_00cea966;
      }
    }
    else {
      if (BVar2 != i32) {
        pcVar5 = "unexpected type";
        goto LAB_00ceaa3b;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        x = '.';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x04') {
        x = ',';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x02') {
        x = '/';
        goto LAB_00cea969;
      }
    }
    pcVar5 = "invalid rmw size";
LAB_00ceaa3b:
    handle_unreachable(pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1ea);
  case RMWOr:
    BVar2 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar2 == i64) {
      bVar4 = curr->bytes - 1;
      if ((bVar4 < 8) && ((0x8bU >> (bVar4 & 0x1f) & 1) != 0)) {
        bVar4 = bVar4 * '\b';
        uVar3 = 0x3437373739373837;
        goto LAB_00cea966;
      }
    }
    else {
      if (BVar2 != i32) {
        pcVar5 = "unexpected type";
        goto LAB_00ceaa6b;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        x = '5';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x04') {
        x = '3';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x02') {
        x = '6';
        goto LAB_00cea969;
      }
    }
    pcVar5 = "invalid rmw size";
LAB_00ceaa6b:
    handle_unreachable(pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1eb);
  case RMWXor:
    BVar2 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar2 == i64) {
      bVar4 = curr->bytes - 1;
      if ((bVar4 < 8) && ((0x8bU >> (bVar4 & 0x1f) & 1) != 0)) {
        bVar4 = bVar4 * '\b';
        uVar3 = 0x3b3e3e3e403e3f3e;
        goto LAB_00cea966;
      }
    }
    else {
      if (BVar2 != i32) {
        pcVar5 = "unexpected type";
        goto LAB_00ceaa23;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        x = '<';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x04') {
        x = ':';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x02') {
        x = '=';
        goto LAB_00cea969;
      }
    }
    pcVar5 = "invalid rmw size";
LAB_00ceaa23:
    handle_unreachable(pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1ec);
  case RMWXchg:
    BVar2 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar2 == i64) {
      bVar4 = curr->bytes - 1;
      if ((bVar4 < 8) && ((0x8bU >> (bVar4 & 0x1f) & 1) != 0)) {
        bVar4 = bVar4 * '\b';
        uVar3 = 0x4245454547454645;
        goto LAB_00cea966;
      }
    }
    else {
      if (BVar2 != i32) {
        pcVar5 = "unexpected type";
        goto LAB_00ceaa9b;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        x = 'C';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x04') {
        x = 'A';
        goto LAB_00cea969;
      }
      if (uVar1 == '\x02') {
        x = 'D';
        goto LAB_00cea969;
      }
    }
    pcVar5 = "invalid rmw size";
LAB_00ceaa9b:
    handle_unreachable(pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1ed);
  default:
    handle_unreachable("unexpected op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1ef);
  }
  BVar2 = wasm::Type::getBasic
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                      type);
  if (BVar2 == i64) {
    bVar4 = curr->bytes - 1;
    if ((bVar4 < 8) && ((0x8bU >> (bVar4 & 0x1f) & 1) != 0)) {
      bVar4 = bVar4 * '\b';
      uVar3 = 0x1f22222224222322;
LAB_00cea966:
      x = (int8_t)(uVar3 >> (bVar4 & 0x3f));
LAB_00cea969:
      BufferWithRandomAccess::operator<<(this->o,x);
      emitMemoryAccess(this,(ulong)curr->bytes,(ulong)curr->bytes,(curr->offset).addr,
                       (Name)(curr->memory).super_IString.str);
      return;
    }
  }
  else {
    if (BVar2 != i32) {
      pcVar5 = "unexpected type";
      goto LAB_00ceaa53;
    }
    uVar1 = curr->bytes;
    if (uVar1 == '\x01') {
      x = ' ';
      goto LAB_00cea969;
    }
    if (uVar1 == '\x04') {
      x = '\x1e';
      goto LAB_00cea969;
    }
    if (uVar1 == '\x02') {
      x = '!';
      goto LAB_00cea969;
    }
  }
  pcVar5 = "invalid rmw size";
LAB_00ceaa53:
  handle_unreachable(pcVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                     ,0x1e8);
}

Assistant:

void BinaryInstWriter::visitAtomicRMW(AtomicRMW* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix);

#define CASE_FOR_OP(Op)                                                        \
  case RMW##Op:                                                                \
    switch (curr->type.getBasic()) {                                           \
      case Type::i32:                                                          \
        switch (curr->bytes) {                                                 \
          case 1:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op##8U);                   \
            break;                                                             \
          case 2:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op##16U);                  \
            break;                                                             \
          case 4:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op);                       \
            break;                                                             \
          default:                                                             \
            WASM_UNREACHABLE("invalid rmw size");                              \
        }                                                                      \
        break;                                                                 \
      case Type::i64:                                                          \
        switch (curr->bytes) {                                                 \
          case 1:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##8U);                   \
            break;                                                             \
          case 2:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##16U);                  \
            break;                                                             \
          case 4:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##32U);                  \
            break;                                                             \
          case 8:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op);                       \
            break;                                                             \
          default:                                                             \
            WASM_UNREACHABLE("invalid rmw size");                              \
        }                                                                      \
        break;                                                                 \
      default:                                                                 \
        WASM_UNREACHABLE("unexpected type");                                   \
    }                                                                          \
    break

  switch (curr->op) {
    CASE_FOR_OP(Add);
    CASE_FOR_OP(Sub);
    CASE_FOR_OP(And);
    CASE_FOR_OP(Or);
    CASE_FOR_OP(Xor);
    CASE_FOR_OP(Xchg);
    default:
      WASM_UNREACHABLE("unexpected op");
  }
#undef CASE_FOR_OP

  emitMemoryAccess(curr->bytes, curr->bytes, curr->offset, curr->memory);
}